

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O3

Accel * __thiscall
embree::BVH8Factory::BVH8UserGeometry(BVH8Factory *this,Scene *scene,BuildVariant bvariant)

{
  long lVar1;
  int iVar2;
  BVH8 *bvh;
  undefined8 *puVar3;
  long *plVar4;
  Builder *pBVar5;
  Accel *pAVar6;
  long *plVar7;
  long *plVar8;
  Intersectors intersectors;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors local_140;
  
  bvh = (BVH8 *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&Object::type,scene);
  BVH8UserGeometryIntersectors(&local_140,this,bvh);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
  if (iVar2 == 0) {
    if (bvariant != STATIC) {
      if (bvariant != DYNAMIC) {
        pBVar5 = (Builder *)0x0;
        goto LAB_00b9f407;
      }
      goto LAB_00b9f3e4;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
      if (iVar2 != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_160,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
        plVar8 = (long *)*plVar4;
        plVar7 = plVar4 + 2;
        if (plVar8 == plVar7) {
          local_170 = *plVar7;
          uStack_168 = (undefined4)plVar4[3];
          uStack_164 = *(undefined4 *)((long)plVar4 + 0x1c);
          plVar8 = &local_170;
        }
        else {
          local_170 = *plVar7;
        }
        lVar1 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        *puVar3 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar3 + 1) = 2;
        puVar3[2] = puVar3 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar3 + 2),plVar8,lVar1 + (long)plVar8);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
LAB_00b9f3e4:
      pBVar5 = (*this->BVH8BuilderTwoLevelVirtualSAH)(bvh,scene,false);
      goto LAB_00b9f407;
    }
  }
  pBVar5 = (*this->BVH8VirtualSceneBuilderSAH)(bvh,scene,0);
LAB_00b9f407:
  pAVar6 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar6->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar6->super_AccelData).type = TY_ACCEL_INSTANCE;
  memcpy(&(pAVar6->super_AccelData).field_0x58,&local_140,0x118);
  (pAVar6->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_0218ab40;
  pAVar6[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pAVar6[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar5;
  return pAVar6;
}

Assistant:

Accel* BVH8Factory::BVH8UserGeometry(Scene* scene, BuildVariant bvariant)
  {
    BVH8* accel = new BVH8(Object::type,scene);
    Accel::Intersectors intersectors = BVH8UserGeometryIntersectors(accel);

    Builder* builder = nullptr;
    if (scene->device->object_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH8VirtualSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH8BuilderTwoLevelVirtualSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->object_builder == "sah") builder = BVH8VirtualSceneBuilderSAH(accel,scene,0);
    else if (scene->device->object_builder == "dynamic") builder = BVH8BuilderTwoLevelVirtualSAH(accel,scene,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH8<Object>");

    return new AccelInstance(accel,builder,intersectors);
  }